

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::MatchExpr<duckdb_string_t,_Catch::Matchers::Generic::PredicateMatcher<duckdb_string_t>_>::
streamReconstructedExpression
          (MatchExpr<duckdb_string_t,_Catch::Matchers::Generic::PredicateMatcher<duckdb_string_t>_>
           *this,ostream *os)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  string matcherAsString;
  char local_61;
  char *local_60;
  long local_58;
  char local_50 [16];
  string local_40;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&local_40,(MatcherUntypedBase *)&this->m_matcher);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,Detail::unprintableString_abi_cxx11_,
             DAT_005d9d68 + (long)Detail::unprintableString_abi_cxx11_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_60,local_58);
  local_61 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_61,1);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  _Var1._M_p = local_40._M_dataplus._M_p;
  if ((local_40._M_string_length == DAT_005d9d68) &&
     ((local_40._M_string_length == 0 ||
      (iVar2 = bcmp(local_40._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                    local_40._M_string_length), iVar2 == 0)))) {
    operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,_Var1._M_p,local_40._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }